

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

LocalVector<unsigned_int> * __thiscall
limonp::LocalVector<unsigned_int>::operator=
          (LocalVector<unsigned_int> *this,LocalVector<unsigned_int> *vec)

{
  size_t sVar1;
  uint *puVar2;
  LocalVector<unsigned_int> *in_RSI;
  LocalVector<unsigned_int> *in_RDI;
  LocalVector<unsigned_int> *in_stack_ffffffffffffffe0;
  uint *__src;
  
  clear(in_stack_ffffffffffffffe0);
  sVar1 = size(in_RSI);
  in_RDI->size_ = sVar1;
  sVar1 = capacity(in_RSI);
  in_RDI->capacity_ = sVar1;
  if (in_RSI == (LocalVector<unsigned_int> *)in_RSI->ptr_) {
    memcpy(in_RDI,in_RSI,in_RDI->size_ << 2);
    in_RDI->ptr_ = in_RDI->buffer_;
  }
  else {
    sVar1 = capacity(in_RSI);
    puVar2 = (uint *)malloc(sVar1 << 2);
    in_RDI->ptr_ = puVar2;
    if (in_RDI->ptr_ == (uint *)0x0) {
      __assert_fail("ptr_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x3e,
                    "LocalVector<T> &limonp::LocalVector<unsigned int>::operator=(const LocalVector<T> &) [T = unsigned int]"
                   );
    }
    puVar2 = in_RDI->ptr_;
    __src = in_RSI->ptr_;
    sVar1 = size(in_RSI);
    memcpy(puVar2,__src,sVar1 << 2);
  }
  return in_RDI;
}

Assistant:

LocalVector<T>& operator = (const LocalVector<T>& vec) {
    clear();
    size_ = vec.size();
    capacity_ = vec.capacity();
    if(vec.buffer_ == vec.ptr_) {
      memcpy(buffer_, vec.buffer_, sizeof(T) * size_);
      ptr_ = buffer_;
    } else {
      ptr_ = (T*) malloc(vec.capacity() * sizeof(T));
      assert(ptr_);
      memcpy(ptr_, vec.ptr_, vec.size() * sizeof(T));
    }
    return *this;
  }